

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstparser-test.cc
# Opt level: O0

void __thiscall ParserTest_Directive_Test::TestBody(ParserTest_Directive_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  char *in_stack_fffffffffffffef0;
  string *actual_expression;
  char *in_stack_fffffffffffffef8;
  int line;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined8 in_stack_ffffffffffffff08;
  Type TVar3;
  AssertHelper *in_stack_ffffffffffffff10;
  string local_c8 [32];
  Message *in_stack_ffffffffffffff58;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff60;
  string local_88 [16];
  char *in_stack_ffffffffffffff88;
  AssertionResult local_68 [3];
  string local_38 [32];
  AssertionResult local_18;
  
  TVar3 = (Type)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_ffffffffffffff88);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (char (*) [9])CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    in_stack_ffffffffffffff10 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10e41b);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,TVar3,
               (char *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x10e478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e4cd);
  TVar3 = (Type)((ulong)local_88 >> 0x20);
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_ffffffffffffff88);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (char (*) [9])CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  std::__cxx11::string::~string(local_88);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_68);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    in_stack_fffffffffffffef8 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10e5ab);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,TVar3,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff00),
               (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),in_stack_fffffffffffffef0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffee0);
    testing::Message::~Message((Message *)0x10e608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e65d);
  actual_expression = local_c8;
  (anonymous_namespace)::Parse_abi_cxx11_(in_stack_ffffffffffffff88);
  testing::internal::EqHelper<false>::Compare<char[9],std::__cxx11::string>
            (in_stack_fffffffffffffef8,(char *)actual_expression,
             (char (*) [9])CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8),
             in_stack_fffffffffffffee0);
  line = (int)((ulong)in_stack_fffffffffffffef8 >> 0x20);
  std::__cxx11::string::~string(local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff58);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff10);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10e72f)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff10,TVar3,(char *)CONCAT17(uVar2,in_stack_ffffffffffffff00),
               line,(char *)actual_expression);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff60.ptr_,in_stack_ffffffffffffff58);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10e77d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10e7cc);
  return;
}

Assistant:

TEST(ParserTest, Directive) {
  EXPECT_EQ("<test />", Parse(".. test::"));
  EXPECT_EQ("<test />", Parse("..  test::"));
  EXPECT_EQ("<test />", Parse("..\ttest::"));
}